

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O3

int VP8ProcessRow(VP8Decoder *dec,VP8Io *io)

{
  VP8MBData *pVVar1;
  VP8FInfo *pVVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  WebPWorkerInterface *pWVar7;
  uint uVar8;
  
  if ((dec->filter_type_ < 1) || (dec->mb_y_ < dec->tl_mb_y_)) {
    bVar3 = false;
  }
  else {
    bVar3 = dec->mb_y_ <= dec->br_mb_y_;
  }
  uVar8 = (uint)bVar3;
  if (dec->mt_method_ != 0) {
    pWVar7 = WebPGetWorkerInterface();
    uVar4 = (*pWVar7->Sync)(&dec->worker_);
    iVar5 = 0;
    if ((uVar4 & 1) != 0) {
      memcpy(&(dec->thread_ctx_).io_,io,0xa0);
      iVar5 = dec->mt_method_;
      (dec->thread_ctx_).id_ = dec->cache_id_;
      (dec->thread_ctx_).mb_y_ = dec->mb_y_;
      (dec->thread_ctx_).filter_row_ = uVar8;
      if (iVar5 == 2) {
        pVVar1 = (dec->thread_ctx_).mb_data_;
        (dec->thread_ctx_).mb_data_ = dec->mb_data_;
        dec->mb_data_ = pVVar1;
      }
      else {
        ReconstructRow(dec,&dec->thread_ctx_);
      }
      if (uVar8 != 0) {
        pVVar2 = (dec->thread_ctx_).f_info_;
        (dec->thread_ctx_).f_info_ = dec->f_info_;
        dec->f_info_ = pVVar2;
      }
      pWVar7 = WebPGetWorkerInterface();
      (*pWVar7->Launch)(&dec->worker_);
      iVar6 = dec->cache_id_ + 1;
      iVar5 = 0;
      if (iVar6 != dec->num_caches_) {
        iVar5 = iVar6;
      }
      dec->cache_id_ = iVar5;
      iVar5 = 1;
    }
    return iVar5;
  }
  (dec->thread_ctx_).mb_y_ = dec->mb_y_;
  (dec->thread_ctx_).filter_row_ = uVar8;
  ReconstructRow(dec,&dec->thread_ctx_);
  iVar5 = FinishRow(dec,io);
  return iVar5;
}

Assistant:

int VP8ProcessRow(VP8Decoder* const dec, VP8Io* const io) {
  int ok = 1;
  VP8ThreadContext* const ctx = &dec->thread_ctx_;
  const int filter_row =
      (dec->filter_type_ > 0) &&
      (dec->mb_y_ >= dec->tl_mb_y_) && (dec->mb_y_ <= dec->br_mb_y_);
  if (dec->mt_method_ == 0) {
    // ctx->id_ and ctx->f_info_ are already set
    ctx->mb_y_ = dec->mb_y_;
    ctx->filter_row_ = filter_row;
    ReconstructRow(dec, ctx);
    ok = FinishRow(dec, io);
  } else {
    WebPWorker* const worker = &dec->worker_;
    // Finish previous job *before* updating context
    ok &= WebPGetWorkerInterface()->Sync(worker);
    assert(worker->status_ == OK);
    if (ok) {   // spawn a new deblocking/output job
      ctx->io_ = *io;
      ctx->id_ = dec->cache_id_;
      ctx->mb_y_ = dec->mb_y_;
      ctx->filter_row_ = filter_row;
      if (dec->mt_method_ == 2) {  // swap macroblock data
        VP8MBData* const tmp = ctx->mb_data_;
        ctx->mb_data_ = dec->mb_data_;
        dec->mb_data_ = tmp;
      } else {
        // perform reconstruction directly in main thread
        ReconstructRow(dec, ctx);
      }
      if (filter_row) {            // swap filter info
        VP8FInfo* const tmp = ctx->f_info_;
        ctx->f_info_ = dec->f_info_;
        dec->f_info_ = tmp;
      }
      // (reconstruct)+filter in parallel
      WebPGetWorkerInterface()->Launch(worker);
      if (++dec->cache_id_ == dec->num_caches_) {
        dec->cache_id_ = 0;
      }
    }
  }
  return ok;
}